

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O2

Privkey * __thiscall
cfd::core::TapBranch::GetTweakedPrivkey
          (Privkey *__return_storage_ptr__,TapBranch *this,Privkey *internal_privkey,bool *parity)

{
  bool is_parity;
  ByteData256 hash;
  SchnorrPubkey internal_pubkey;
  Privkey privkey;
  bool local_91;
  Privkey local_90;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  Privkey local_58;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  local_91 = false;
  SchnorrPubkey::FromPrivkey((SchnorrPubkey *)&local_70,internal_privkey,&local_91);
  Privkey::Privkey(&local_58,internal_privkey);
  if (local_91 == true) {
    Privkey::CreateNegate(&local_90,internal_privkey);
    Privkey::operator=(&local_58,&local_90);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90);
  }
  GetTapTweak((ByteData256 *)&local_90,this,(SchnorrPubkey *)&local_70);
  SchnorrPubkey::CreateTweakAdd
            ((SchnorrPubkey *)&local_38,(SchnorrPubkey *)&local_70,(ByteData256 *)&local_90,
             &local_91);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  if (parity != (bool *)0x0) {
    *parity = local_91;
  }
  Privkey::CreateTweakAdd(__return_storage_ptr__,&local_58,(ByteData256 *)&local_90);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_70);
  return __return_storage_ptr__;
}

Assistant:

Privkey TapBranch::GetTweakedPrivkey(
    const Privkey& internal_privkey, bool* parity) const {
  bool is_parity = false;
  auto internal_pubkey =
      SchnorrPubkey::FromPrivkey(internal_privkey, &is_parity);
  Privkey privkey = internal_privkey;
  if (is_parity) privkey = internal_privkey.CreateNegate();

  ByteData256 hash = GetTapTweak(internal_pubkey);
  internal_pubkey.CreateTweakAdd(hash, &is_parity);
  if (parity != nullptr) *parity = is_parity;
  return privkey.CreateTweakAdd(hash);
}